

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O2

FT_UInt tt_cmap14_def_char_count(FT_Byte *p)

{
  uint uVar1;
  FT_UInt FVar2;
  long lVar3;
  
  uVar1 = *(uint *)p;
  FVar2 = 0;
  for (lVar3 = 0;
      (uint)lVar3 !=
      (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
      lVar3 = lVar3 + 1) {
    FVar2 = FVar2 + p[lVar3 * 4 + 7] + 1;
  }
  return FVar2;
}

Assistant:

static FT_UInt
  tt_cmap14_def_char_count( FT_Byte  *p )
  {
    FT_UInt32  numRanges = (FT_UInt32)TT_NEXT_ULONG( p );
    FT_UInt    tot       = 0;


    p += 3;  /* point to the first `cnt' field */
    for ( ; numRanges > 0; numRanges-- )
    {
      tot += 1 + p[0];
      p   += 4;
    }

    return tot;
  }